

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_printer.c
# Opt level: O3

void flatcc_json_printer_int64_enum_vector_field
               (flatcc_json_printer_t *ctx,flatcc_json_printer_table_descriptor_t *td,int id,
               char *name,size_t len,flatcc_json_printer_int64_enum_f *pf)

{
  uint uVar1;
  long lVar2;
  int iVar3;
  char *pcVar4;
  size_t sVar5;
  uint *puVar6;
  int64_t *piVar7;
  char *pcVar8;
  ulong __n;
  ulong uVar9;
  
  if (ctx->noenum != '\0') {
    flatcc_json_printer_int64_vector_field(ctx,td,id,name,len);
    return;
  }
  uVar1 = id * 2 + 4;
  if ((uVar1 < (uint)td->vsize) &&
     (uVar9 = (ulong)*(ushort *)((long)td->vtable + (ulong)uVar1), uVar9 != 0)) {
    puVar6 = (uint *)(uVar9 + (long)td->table);
    iVar3 = td->count;
    td->count = iVar3 + 1;
    if (iVar3 != 0) {
      pcVar8 = ctx->p;
      ctx->p = pcVar8 + 1;
      *pcVar8 = ',';
    }
    uVar9 = (ulong)*puVar6;
    iVar3 = *(int *)((long)puVar6 + uVar9);
    print_name(ctx,name,len);
    ctx->level = ctx->level + 1;
    pcVar8 = ctx->p;
    ctx->p = pcVar8 + 1;
    *pcVar8 = '[';
    if (iVar3 != 0) {
      pcVar8 = ctx->p;
      if (ctx->indent == '\0') {
        if (ctx->pflush <= pcVar8) {
          (*ctx->flush)(ctx,0);
        }
      }
      else {
        ctx->p = pcVar8 + 1;
        *pcVar8 = '\n';
        __n = (ulong)ctx->indent * (long)ctx->level;
        pcVar8 = ctx->pflush;
        pcVar4 = ctx->p;
        if (pcVar8 < pcVar4 + __n) {
          if (pcVar8 <= pcVar4) {
            (*ctx->flush)(ctx,0);
            pcVar8 = ctx->pflush;
            pcVar4 = ctx->p;
          }
          sVar5 = (long)pcVar8 - (long)pcVar4;
          if (sVar5 < __n) {
            do {
              memset(pcVar4,0x20,sVar5);
              ctx->p = ctx->p + sVar5;
              __n = __n - sVar5;
              (*ctx->flush)(ctx,0);
              pcVar4 = ctx->p;
              sVar5 = (long)ctx->pflush - (long)pcVar4;
            } while (sVar5 < __n);
          }
        }
        memset(pcVar4,0x20,__n);
        ctx->p = ctx->p + __n;
      }
      (*pf)(ctx,*(int64_t *)((long)puVar6 + uVar9 + 4));
      iVar3 = iVar3 + -1;
      if (iVar3 != 0) {
        piVar7 = (int64_t *)((long)puVar6 + uVar9 + 0xc);
        do {
          pcVar8 = ctx->p;
          ctx->p = pcVar8 + 1;
          *pcVar8 = ',';
          pcVar8 = ctx->p;
          if (ctx->indent == '\0') {
            if (ctx->pflush <= pcVar8) {
              (*ctx->flush)(ctx,0);
            }
          }
          else {
            ctx->p = pcVar8 + 1;
            *pcVar8 = '\n';
            uVar9 = (ulong)ctx->indent * (long)ctx->level;
            pcVar8 = ctx->pflush;
            pcVar4 = ctx->p;
            if (pcVar8 < pcVar4 + uVar9) {
              if (pcVar8 <= pcVar4) {
                (*ctx->flush)(ctx,0);
                pcVar8 = ctx->pflush;
                pcVar4 = ctx->p;
              }
              sVar5 = (long)pcVar8 - (long)pcVar4;
              if (sVar5 < uVar9) {
                do {
                  memset(pcVar4,0x20,sVar5);
                  ctx->p = ctx->p + sVar5;
                  uVar9 = uVar9 - sVar5;
                  (*ctx->flush)(ctx,0);
                  pcVar4 = ctx->p;
                  sVar5 = (long)ctx->pflush - (long)pcVar4;
                } while (sVar5 < uVar9);
              }
            }
            memset(pcVar4,0x20,uVar9);
            ctx->p = ctx->p + uVar9;
          }
          iVar3 = iVar3 + -1;
          (*pf)(ctx,*piVar7);
          piVar7 = piVar7 + 1;
        } while (iVar3 != 0);
      }
    }
    pcVar8 = ctx->p;
    if (ctx->indent != '\0') {
      ctx->p = pcVar8 + 1;
      *pcVar8 = '\n';
      lVar2 = (long)ctx->level + -1;
      ctx->level = (int)lVar2;
      uVar9 = (ulong)ctx->indent * lVar2;
      pcVar8 = ctx->pflush;
      pcVar4 = ctx->p;
      if (pcVar8 < pcVar4 + uVar9) {
        if (pcVar8 <= pcVar4) {
          (*ctx->flush)(ctx,0);
          pcVar8 = ctx->pflush;
          pcVar4 = ctx->p;
        }
        sVar5 = (long)pcVar8 - (long)pcVar4;
        if (sVar5 < uVar9) {
          do {
            memset(pcVar4,0x20,sVar5);
            ctx->p = ctx->p + sVar5;
            uVar9 = uVar9 - sVar5;
            (*ctx->flush)(ctx,0);
            pcVar4 = ctx->p;
            sVar5 = (long)ctx->pflush - (long)pcVar4;
          } while (sVar5 < uVar9);
        }
      }
      memset(pcVar4,0x20,uVar9);
      pcVar8 = ctx->p + uVar9;
    }
    ctx->p = pcVar8 + 1;
    *pcVar8 = ']';
  }
  return;
}

Assistant:

void flatcc_json_printer_struct_vector_field(flatcc_json_printer_t *ctx,
        flatcc_json_printer_table_descriptor_t *td,
        int id, const char *name, size_t len,
        size_t size,
        flatcc_json_printer_struct_f pf)
{
    const uint8_t *p = get_field_ptr(td, id);
    uoffset_t count;

    if (p) {
        if (td->count++) {
            print_char(',');
        }
        p = read_uoffset_ptr(p);
        count = __flatbuffers_uoffset_read_from_pe(p);
        p += uoffset_size;
        print_name(ctx, name, len);
        print_start('[');
        if (count) {
            print_nl();
            print_start('{');
            pf(ctx, p);
            print_end('}');
            --count;
        }
        while (count--) {
            p += size;
            print_char(',');
            print_nl();
            print_start('{');
            pf(ctx, p);
            print_end('}');
        }
        print_end(']');
    }
}